

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O0

void __thiscall
SoapySDR::Registry::Registry
          (Registry *this,string *name,FindFunction *find,MakeFunction *make,string *abi)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  mapped_type *__k;
  size_type sVar3;
  FunctionsEntry *this_00;
  mapped_type *pmVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  string *in_RSI;
  string *in_RDI;
  FunctionsEntry entry;
  string *errorMsg;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
  *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  key_type *in_stack_fffffffffffffe88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *in_stack_fffffffffffffe90;
  string local_140 [32];
  undefined8 local_120;
  undefined8 local_118;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  undefined4 local_8c;
  string local_88 [32];
  string local_68 [32];
  mapped_type *local_48;
  undefined8 *local_20;
  undefined8 *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  getRegistryMutex();
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
            );
  getLoaderResults_abi_cxx11_();
  psVar2 = getModuleLoading_abi_cxx11_();
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)__rhs,in_stack_fffffffffffffe88);
  local_48 = __k;
  bVar1 = std::operator!=(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
  if (bVar1) {
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::__cxx11::string::operator=((string *)local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    local_8c = 1;
  }
  else {
    getFunctionTable_abi_cxx11_();
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
            ::count(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (sVar3 == 0) {
      FunctionsEntry::FunctionsEntry((FunctionsEntry *)0x1560f6);
      psVar2 = getModuleLoading_abi_cxx11_();
      std::__cxx11::string::operator=(local_140,(string *)psVar2);
      local_120 = *local_18;
      local_118 = *local_20;
      this_00 = (FunctionsEntry *)getFunctionTable_abi_cxx11_();
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
                             *)__rhs,__k);
      FunctionsEntry::operator=(this_00,pmVar4);
      std::__cxx11::string::operator=(in_RDI,local_10);
      FunctionsEntry::~FunctionsEntry((FunctionsEntry *)0x15618b);
      local_8c = 0;
    }
    else {
      std::operator+((char *)psVar2,__rhs);
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      getFunctionTable_abi_cxx11_();
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
                    *)__rhs,__k);
      std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::__cxx11::string::operator=((string *)local_48,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      local_8c = 1;
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1561a3);
  return;
}

Assistant:

SoapySDR::Registry::Registry(const std::string &name, const FindFunction &find, const MakeFunction &make, const std::string &abi)
{
    std::lock_guard<std::recursive_mutex> lock(getRegistryMutex());

    //create an entry for the loader result
    std::string &errorMsg = getLoaderResults()[getModuleLoading()][name];

    //abi check
    if (abi != SOAPY_SDR_ABI_VERSION)
    {
        errorMsg = name + " failed ABI check: Library ABI=" SOAPY_SDR_ABI_VERSION ", Module ABI="+abi;
        return;
    }

    //duplicate check
    if (getFunctionTable().count(name) != 0)
    {
        errorMsg = "duplicate entry for " + name + " ("+getFunctionTable()[name].modulePath + ")";
        return;
    }

    //register functions
    FunctionsEntry entry;
    entry.modulePath = getModuleLoading();
    entry.find = find;
    entry.make = make;
    getFunctionTable()[name] = entry;
    _name = name;
}